

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  bool bVar11;
  undefined7 uVar12;
  
  uVar10 = *(undefined4 *)&info->field_0x34;
  (this->m_info).resultDisposition = info->resultDisposition;
  *(undefined4 *)&(this->m_info).field_0x34 = uVar10;
  pcVar4 = (info->macroName).m_start;
  sVar5 = (info->macroName).m_size;
  pcVar6 = (info->lineInfo).file;
  sVar7 = (info->lineInfo).line;
  sVar8 = (info->capturedExpression).m_size;
  (this->m_info).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_info).capturedExpression.m_size = sVar8;
  (this->m_info).lineInfo.file = pcVar6;
  (this->m_info).lineInfo.line = sVar7;
  (this->m_info).macroName.m_start = pcVar4;
  (this->m_info).macroName.m_size = sVar5;
  paVar1 = &(this->m_resultData).message.field_2;
  (this->m_resultData).message._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (data->message)._M_dataplus._M_p;
  paVar2 = &(data->message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar9 = *(undefined8 *)((long)&(data->message).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_resultData).message.field_2 + 8) = uVar9;
  }
  else {
    (this->m_resultData).message._M_dataplus._M_p = pcVar3;
    (this->m_resultData).message.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_resultData).message._M_string_length = (data->message)._M_string_length;
  (data->message)._M_dataplus._M_p = (pointer)paVar2;
  (data->message)._M_string_length = 0;
  (data->message).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->m_resultData).reconstructedExpression.field_2;
  (this->m_resultData).reconstructedExpression._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (data->reconstructedExpression)._M_dataplus._M_p;
  paVar2 = &(data->reconstructedExpression).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar9 = *(undefined8 *)((long)&(data->reconstructedExpression).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_resultData).reconstructedExpression.field_2 + 8) = uVar9;
  }
  else {
    (this->m_resultData).reconstructedExpression._M_dataplus._M_p = pcVar3;
    (this->m_resultData).reconstructedExpression.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->m_resultData).reconstructedExpression._M_string_length =
       (data->reconstructedExpression)._M_string_length;
  (data->reconstructedExpression)._M_dataplus._M_p = (pointer)paVar2;
  (data->reconstructedExpression)._M_string_length = 0;
  (data->reconstructedExpression).field_2._M_local_buf[0] = '\0';
  (this->m_resultData).resultType = data->resultType;
  bVar11 = (data->lazyExpression).m_isNegated;
  uVar12 = *(undefined7 *)&(data->lazyExpression).field_0x9;
  (this->m_resultData).lazyExpression.m_transientExpression =
       (data->lazyExpression).m_transientExpression;
  (this->m_resultData).lazyExpression.m_isNegated = bVar11;
  *(undefined7 *)&(this->m_resultData).lazyExpression.field_0x9 = uVar12;
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData&& data )
    :   m_info( info ),
        m_resultData( CATCH_MOVE(data) )
    {}